

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelInstance.cpp
# Opt level: O2

void __thiscall ModelInstance::transition(ModelInstance *this,float x)

{
  NetworkArray *this_00;
  reference pvVar1;
  reference pvVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  double dVar8;
  array<float,_36UL> cumulative;
  
  this_00 = &this->network;
  pvVar1 = std::array<std::array<float,_36UL>,_36UL>::at(&this_00->transitions,(long)this->state);
  pvVar2 = std::array<std::array<float,_36UL>,_36UL>::at(&this_00->transitions,(long)this->state);
  dVar8 = std::accumulate<float*,double>(pvVar1->_M_elems,pvVar2[1]._M_elems,0.0);
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    lVar7 = 0;
    memset(&cumulative,0,0x90);
    pvVar1 = std::array<std::array<float,_36UL>,_36UL>::at(&this_00->transitions,(long)this->state);
    pvVar2 = std::array<std::array<float,_36UL>,_36UL>::at(&this_00->transitions,(long)this->state);
    std::partial_sum<float*,float*>(pvVar1->_M_elems,pvVar2[1]._M_elems,cumulative._M_elems);
    for (lVar5 = 0x90; lVar5 != 0; lVar5 = lVar5 + -4) {
      if (x < cumulative._M_elems[lVar7]) {
        uVar3 = this->state;
        uVar6 = (uint)lVar7;
        if (uVar3 - 6 < 6 && uVar3 + 6 == uVar6) {
          return;
        }
        iVar4 = (int)uVar3 % 6;
        if (uVar6 == uVar3 + 1 && iVar4 == 1) {
          return;
        }
        if (1 < iVar4 && uVar3 - iVar4 == uVar6) {
          std::vector<float,_std::allocator<float>_>::push_back
                    ((this->dimersactive)._M_elems,&this->currenttime);
          uVar3 = this->state;
        }
        if ((0xb < (int)uVar3) && (uVar3 % 6 == uVar6)) {
          std::vector<float,_std::allocator<float>_>::push_back
                    ((this->dimersactive)._M_elems + 1,&this->currenttime);
        }
        this->state = uVar6;
        updateStep(this);
        return;
      }
      lVar7 = lVar7 + 1;
    }
  }
  return;
}

Assistant:

void ModelInstance::transition(float x) {
	// No outgoing edges, then stay in this state
	if (std::accumulate(network.transitions.at(state).begin(), network.transitions.at(state).end(), 0.0) == 0){
		return;
	}

	// Iterate over outgoing edges, find the one to take depending on the random number x
	std::array<float, 36> cumulative{};
	std::partial_sum(network.transitions.at(state).begin(), network.transitions.at(state).end(), cumulative.begin());
	int index = 0;
	for (float threshold : cumulative){
		if (x < threshold){
			//It is not one of transitions where S is activated
			bool activatingS = (state / 6 == 1 && index == state + 6) ||
							   (state % 6 == 1 && index == state + 1);
			if (!activatingS){
				if (state % 6 >= 2 && index == state - (state % 6)) {
					dimersactive.at(0).push_back(currenttime);
					//std::cout << "inactivate complex 1" << std::endl;
				}
				if (state / 6 >= 2 && index == state % 6) {
					dimersactive.at(1).push_back(currenttime);
					//std::cout << "inactivate complex 2" << std::endl;
				}
				// if not adding Si, position does not matter, else make sure it is close enough or do nothing
				state = index;
				updateStep();
			}
			break;
		}
		index++;
	}
}